

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall BMP::writeFrequencyProbability(BMP *this,ofstream *out)

{
  pointer pcVar1;
  uint uVar2;
  longdouble lVar3;
  ostream *poVar4;
  GreyCount *pGVar5;
  long lVar6;
  GreyCount *pGVar7;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  lVar6 = (long)this->alphabet->num;
  if (lVar6 != 0) {
    pGVar5 = this->alphabet->symbol;
    if (out == (ofstream *)0x0) {
      out = (ofstream *)&std::cout;
    }
    pGVar7 = pGVar5 + lVar6;
    do {
      uVar2 = *(uint *)&pGVar5->tone;
      lVar3 = pGVar5->frq;
      pcVar1 = (pGVar5->uniformCodes)._M_dataplus._M_p;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + (pGVar5->uniformCodes)._M_string_length);
      local_78[0] = local_68;
      pcVar1 = (pGVar5->codeShannonFano)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar1,pcVar1 + (pGVar5->codeShannonFano)._M_string_length);
      pcVar1 = (pGVar5->codeHuffman)._M_dataplus._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + (pGVar5->codeHuffman)._M_string_length);
      lVar6 = *(long *)out;
      *(undefined8 *)((ostream *)out + *(long *)(lVar6 + -0x18) + 0x10) = 8;
      *(uint *)((ostream *)out + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)((ostream *)out + *(long *)(lVar6 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)((ostream *)out + *(long *)(lVar6 + -0x18) + 8) = 5;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)out,uVar2 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
      poVar4 = std::ostream::_M_insert<long_double>(lVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0]);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
      pGVar5 = pGVar5 + 1;
    } while (pGVar5 != pGVar7);
  }
  return;
}

Assistant:

void BMP::writeFrequencyProbability( std::ofstream *out )
{
    using namespace std;
    bool flag;
    if ( out != nullptr )
        flag = true;
    else
        flag = false;

    for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( bitMap::GreyCount a ){
        if ( flag ) {
            ( *out ) << setw( 8 ) << fixed << setprecision( 5 ) << ( int ) a.tone << ": " << a.frq << endl;
        } else {
            cout << setw( 8 ) << fixed << setprecision( 5 ) << ( int ) a.tone << ": " << a.frq << endl;
        }
    });
}